

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O3

void restore_attrib(void)

{
  int iVar1;
  int iVar2;
  long lVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  
  iVar1 = (int)u.abon.a[4];
  iVar2 = (int)u.acurr.a[4];
  lVar3 = 0;
  do {
    cVar5 = u.atemp.a[lVar3];
    if ((((cVar5 != '\0') && (cVar4 = u.atime.a[lVar3], cVar4 != '\0')) &&
        (cVar4 = cVar4 + -1, u.atime.a[lVar3] = cVar4, cVar4 == '\0')) &&
       (cVar5 = (-('\0' < cVar5) | 1U) + cVar5, u.atemp.a[lVar3] = cVar5, cVar5 != '\0')) {
      iVar6 = (int)u.atemp.a[4] + iVar2 + iVar1;
      if (iVar6 < 4) {
        iVar6 = 3;
      }
      if (0x18 < iVar6) {
        iVar6 = 0x19;
      }
      u.atime.a[lVar3] = (schar)(100 / (byte)iVar6);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  encumber_msg();
  return;
}

Assistant:

void restore_attrib(void)
{
	int	i;

	for (i = 0; i < A_MAX; i++) {	/* all temporary losses/gains */

	   if (ATEMP(i) && ATIME(i)) {
		if (!(--(ATIME(i)))) { /* countdown for change */
		    ATEMP(i) += ATEMP(i) > 0 ? -1 : 1;

		    if (ATEMP(i)) /* reset timer */
			ATIME(i) = 100 / ACURR(A_CON);
		}
	    }
	}
	encumber_msg();
}